

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,int start,int num,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  Arena *pAVar1;
  Rep *pRVar2;
  void **ppvVar3;
  string *psVar4;
  Nonnull<const_char_*> failure_msg;
  int i;
  ulong uVar5;
  ulong uVar6;
  LogMessage LStack_48;
  ulong local_38;
  
  uVar5 = (ulong)(uint)start;
  if (start < 0) {
    RepeatedPtrField<std::__cxx11::string>::ExtractSubrange();
LAB_00951ade:
    RepeatedPtrField<std::__cxx11::string>::ExtractSubrange();
  }
  else {
    if (num < 0) goto LAB_00951ade;
    if (num + start <= (this->super_RepeatedPtrFieldBase).current_size_) {
      if (num == 0) {
        return;
      }
      if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
        pAVar1 = (this->super_RepeatedPtrFieldBase).arena_;
        ppvVar3 = (void **)this;
        if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar2 = protobuf::internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
          ppvVar3 = pRVar2->elements;
        }
        local_38 = uVar5;
        if (pAVar1 == (Arena *)0x0) {
          memcpy(elements,ppvVar3 + uVar5,(ulong)(uint)num << 3);
        }
        else {
          uVar6 = 0;
          do {
            psVar4 = protobuf::internal::CloneSlow((Arena *)0x0,(string *)(ppvVar3 + uVar5)[uVar6]);
            elements[uVar6] = psVar4;
            uVar6 = uVar6 + 1;
          } while ((uint)num != uVar6);
        }
        protobuf::internal::RepeatedPtrFieldBase::CloseGap
                  (&this->super_RepeatedPtrFieldBase,(int)local_38,num);
        return;
      }
      goto LAB_00951af0;
    }
  }
  RepeatedPtrField<std::__cxx11::string>::ExtractSubrange();
LAB_00951af0:
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                          ((void *)0x0,(void *)0x0,"elements != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x59c,failure_msg);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&LStack_48,
             (char (*) [107])
             "Releasing elements without transferring ownership is an unsafe operation.  Use UnsafeArenaExtractSubrange."
            );
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_48)
  ;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrange(int start, int num,
                                                       Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num == 0) return;

  ABSL_DCHECK_NE(elements, nullptr)
      << "Releasing elements without transferring ownership is an unsafe "
         "operation.  Use UnsafeArenaExtractSubrange.";
  if (elements != nullptr) {
    Arena* arena = GetArena();
    auto* extracted = data() + start;
    if (internal::DebugHardenForceCopyInRelease()) {
      // Always copy.
      for (int i = 0; i < num; ++i) {
        elements[i] = copy<TypeHandler>(extracted[i]);
      }
      if (arena == nullptr) {
        for (int i = 0; i < num; ++i) {
          delete extracted[i];
        }
      }
    } else {
      // If we're on an arena, we perform a copy for each element so that the
      // returned elements are heap-allocated. Otherwise, just forward it.
      if (arena != nullptr) {
        for (int i = 0; i < num; ++i) {
          elements[i] = copy<TypeHandler>(extracted[i]);
        }
      } else {
        memcpy(elements, extracted, num * sizeof(Element*));
      }
    }
  }
  CloseGap(start, num);
}